

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run-emitter-test-suite.c
# Opt level: O2

int get_line(FILE *input,char *line)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = fgets(line,0x3ff,(FILE *)input);
  if (pcVar2 == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    pcVar2 = strchr(line,10);
    if (pcVar2 == (char *)0x0) {
      fprintf(_stderr,"Line too long: \'%s\'",line);
      abort();
    }
    *pcVar2 = '\0';
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int get_line(FILE * input, char *line)
{
    char *newline;

    if (!fgets(line, 1024 - 1, input))
        return 0;

    if ((newline = strchr(line, '\n')) == NULL) {
        fprintf(stderr, "Line too long: '%s'", line);
        abort();
    }
    *newline = '\0';

    return 1;
}